

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_SubDRTreeVertexFinder *
ON_SubDRTreeVertexFinder::Create
          (ON_SubDRTreeVertexFinder *__return_storage_ptr__,ON_3dPoint P,
          MarkBitsFilter mark_bits_filter,ON__UINT8 mark_bits)

{
  ON_3dPoint P_00;
  double in_stack_ffffffffffffffc0;
  ON_SubDRTreeVertexFinder *vf;
  ON__UINT8 mark_bits_local;
  MarkBitsFilter mark_bits_filter_local;
  
  P_00.z = in_stack_ffffffffffffffc0;
  P_00.x = (double)SUB168(P._8_16_,0);
  P_00.y = (double)SUB168(P._8_16_,8);
  Create(P_00);
  __return_storage_ptr__->m_mark_bits_filter = mark_bits_filter;
  __return_storage_ptr__->m_mark_bits = mark_bits;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDRTreeVertexFinder ON_SubDRTreeVertexFinder::Create(
  const ON_3dPoint P,
  ON_SubDRTreeVertexFinder::MarkBitsFilter mark_bits_filter,
  ON__UINT8 mark_bits
)
{
  ON_SubDRTreeVertexFinder vf = ON_SubDRTreeVertexFinder::Create(P);
  vf.m_mark_bits_filter = mark_bits_filter;
  vf.m_mark_bits = mark_bits;
  return vf;
}